

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forwarder.c
# Opt level: O1

int ndn_forwarder_remove_route(ndn_face_intf_t *face,uint8_t *prefix,size_t length)

{
  byte bVar1;
  int iVar2;
  ndn_fib_entry_t *entry;
  
  if (face != (ndn_face_intf_t *)0x0) {
    iVar2 = -0x36;
    if (face->face_id < (forwarder.facetab)->capacity) {
      iVar2 = tlv_check_type_length(prefix,length,7);
      if (iVar2 == 0) {
        entry = ndn_fib_find(forwarder.fib,prefix,length);
        if (entry == (ndn_fib_entry_t *)0x0) {
          iVar2 = -0x32;
        }
        else {
          bVar1 = (byte)face->face_id & 0x3f;
          entry->nexthop = entry->nexthop & (-2L << bVar1 | 0xfffffffffffffffeU >> 0x40 - bVar1);
          ndn_fib_remove_entry_if_empty(forwarder.fib,entry);
          iVar2 = 0;
        }
      }
    }
    return iVar2;
  }
  return -0x10;
}

Assistant:

int
ndn_forwarder_remove_route(ndn_face_intf_t* face, uint8_t* prefix, size_t length)
{
  int ret;

  if(face == NULL)
    return NDN_INVALID_POINTER;
  if(face->face_id >= forwarder.facetab->capacity)
    return NDN_FWD_INVALID_FACE;
  ret = tlv_check_type_length(prefix, length, TLV_Name);
  if(ret != NDN_SUCCESS)
    return ret;

  ndn_fib_entry_t* fib_entry = ndn_fib_find(forwarder.fib, prefix, length);
  if (fib_entry == NULL)
    return NDN_FWD_NO_EFFECT;
  fib_entry->nexthop = bitset_unset(fib_entry->nexthop, face->face_id);
  ndn_fib_remove_entry_if_empty(forwarder.fib, fib_entry);
  return NDN_SUCCESS;
}